

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O0

parser * visuals_file_parser_init(void)

{
  visuals_parse_context *v;
  parser *parser;
  visuals_parse_context *context;
  
  v = visuals_parse_context_new();
  context = (visuals_parse_context *)parser_new();
  if ((v == (visuals_parse_context *)0x0) || ((parser *)context == (parser *)0x0)) {
    context = (visuals_parse_context *)0x0;
  }
  else {
    parser_setpriv((parser *)context,v);
    parser_reg((parser *)context,"flicker sym color str name",visuals_parse_flicker);
    parser_reg((parser *)context,"flicker-color sym color",visuals_parse_flicker_color);
    parser_reg((parser *)context,"cycle sym group sym name",visuals_parse_cycle);
    parser_reg((parser *)context,"cycle-color sym color",visuals_parse_cycle_color);
  }
  return (parser *)context;
}

Assistant:

static struct parser *visuals_file_parser_init(void)
{
	struct visuals_parse_context *context = visuals_parse_context_new();
	struct parser *parser = parser_new();

	if (context == NULL || parser == NULL) {
		return NULL;
	}

	parser_setpriv(parser, context);
	parser_reg(parser, "flicker sym color str name", visuals_parse_flicker);
	parser_reg(parser, "flicker-color sym color", visuals_parse_flicker_color);
	parser_reg(parser, "cycle sym group sym name", visuals_parse_cycle);
	parser_reg(parser, "cycle-color sym color", visuals_parse_cycle_color);
	return parser;
}